

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_closeCStream(HUF_CStream_t *bitC)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  HUF_CElt endMark;
  HUF_CElt local_18;
  
  local_18 = 1;
  HUF_setValue(&local_18,1);
  if (0xc < (local_18 & 0xff)) {
    __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
  }
  uVar6 = local_18 & 0xffffffffffffff00 | bitC->bitContainer[0] >> ((byte)local_18 & 0x3f);
  bitC->bitContainer[0] = uVar6;
  uVar7 = local_18 + bitC->bitPos[0];
  bitC->bitPos[0] = uVar7;
  uVar3 = uVar7 & 0xff;
  if (0x40 < uVar3) {
    __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
  }
  bitC->bitPos[0] = (ulong)((uint)uVar7 & 7);
  if (uVar3 == 0) {
    __assert_fail("nbBits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
  }
  puVar1 = (ulong *)bitC->ptr;
  puVar2 = (ulong *)bitC->endPtr;
  if (puVar1 <= puVar2) {
    puVar4 = (ulong *)((uVar3 >> 3) + (long)puVar1);
    if (puVar2 < puVar4) {
      puVar4 = puVar2;
    }
    *puVar1 = uVar6 >> (-(char)uVar7 & 0x3fU);
    bitC->ptr = (BYTE *)puVar4;
    if (puVar4 < puVar2) {
      sVar5 = (long)puVar4 + ((1 - (long)bitC->startPtr) - (ulong)((char)bitC->bitPos[0] == '\0'));
    }
    else {
      sVar5 = 0;
    }
    return sVar5;
  }
  __assert_fail("bitC->ptr <= bitC->endPtr",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
}

Assistant:

static size_t HUF_closeCStream(HUF_CStream_t* bitC)
{
    HUF_addBits(bitC, HUF_endMark(), /* idx */ 0, /* kFast */ 0);
    HUF_flushBits(bitC, /* kFast */ 0);
    {
        size_t const nbBits = bitC->bitPos[0] & 0xFF;
        if (bitC->ptr >= bitC->endPtr) return 0; /* overflow detected */
        return (size_t)(bitC->ptr - bitC->startPtr) + (nbBits > 0);
    }
}